

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_sink.h
# Opt level: O0

void __thiscall
spdlog::sinks::udp_sink<std::mutex>::sink_it_(udp_sink<std::mutex> *this,log_msg *msg)

{
  pointer pfVar1;
  char *pcVar2;
  void *__buf;
  size_t in_RCX;
  undefined8 in_RSI;
  long in_RDI;
  int in_R8D;
  memory_buf_t formatted;
  allocator<char> *in_stack_fffffffffffffe88;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this_00;
  allocator<char> local_131;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> local_130;
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::allocator<char>::~allocator(&local_131);
  pfVar1 = std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator->
                     ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
                      0x151fec);
  (*pfVar1->_vptr_formatter[2])(pfVar1,local_10,&local_130);
  this_00 = &local_130;
  pcVar2 = ::fmt::v8::detail::buffer<char>::data(&this_00->super_buffer<char>);
  __buf = (void *)::fmt::v8::detail::buffer<char>::size(&this_00->super_buffer<char>);
  details::udp_client::send((udp_client *)(in_RDI + 0x40),(int)pcVar2,__buf,in_RCX,in_R8D);
  ::fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer(this_00);
  return;
}

Assistant:

void sink_it_(const spdlog::details::log_msg &msg) override
    {
        spdlog::memory_buf_t formatted;
        spdlog::sinks::base_sink<Mutex>::formatter_->format(msg, formatted);
        client_.send(formatted.data(), formatted.size());
    }